

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playerhand_test.cpp
# Opt level: O0

void __thiscall
TEST_PlayerHandTest_LastDrawTile_Test::testBody(TEST_PlayerHandTest_LastDrawTile_Test *this)

{
  Tile TVar1;
  UtestShell *pUVar2;
  PlayerHand *pPVar3;
  NormalTestTerminator local_30 [3];
  NormalTestTerminator local_18;
  TEST_PlayerHandTest_LastDrawTile_Test *local_10;
  TEST_PlayerHandTest_LastDrawTile_Test *this_local;
  
  pPVar3 = &(this->super_TEST_GROUP_CppUTestGroupPlayerHandTest).h;
  local_10 = this;
  mahjong::PlayerHand::add(pPVar3,OneOfCircles);
  pUVar2 = UtestShell::getCurrent();
  TVar1 = mahjong::PlayerHand::lastTile(pPVar3);
  local_18.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
  NormalTestTerminator::NormalTestTerminator(&local_18);
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)(TVar1 == OneOfCircles),"CHECK","Tile::OneOfCircles == h.lastTile()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/playerhand_test.cpp"
             ,0x10,&local_18);
  NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1c4362);
  pPVar3 = &(this->super_TEST_GROUP_CppUTestGroupPlayerHandTest).h;
  mahjong::PlayerHand::add(pPVar3,TwoOfCircles);
  pUVar2 = UtestShell::getCurrent();
  TVar1 = mahjong::PlayerHand::lastTile(pPVar3);
  local_30[0].super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
  NormalTestTerminator::NormalTestTerminator(local_30);
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)(TVar1 == TwoOfCircles),"CHECK","Tile::TwoOfCircles == h.lastTile()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/playerhand_test.cpp"
             ,0x13,local_30);
  NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1c43f1);
  return;
}

Assistant:

TEST(PlayerHandTest, LastDrawTile)
{
	h.add(Tile::OneOfCircles);
	CHECK(Tile::OneOfCircles == h.lastTile());

	h.add(Tile::TwoOfCircles);
	CHECK(Tile::TwoOfCircles == h.lastTile());
}